

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O3

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
ContIntToDescriptor(ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                    *this,uint off_L,ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::ContIntToDescriptor
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             off_L,L,Qc);
  uVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar3 = (ulong)(off_L + 3);
  if ((long)uVar3 < (long)uVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar4 = (ulong)(off_L + 4);
    (this->Rx).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
    .super_ChConstraint.l_i = pdVar2[uVar3];
    if (uVar4 < uVar1) {
      uVar5 = (ulong)(off_L + 5);
      (this->Ru).
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
      .super_ChConstraint.l_i = pdVar2[uVar4];
      if (uVar5 < uVar1) {
        (this->Rv).
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        .super_ChConstraint.l_i = pdVar2[uVar5];
        uVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
        if ((long)uVar3 < (long)uVar1) {
          pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          (this->Rx).
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
          .super_ChConstraint.b_i = pdVar2[uVar3];
          if ((uVar4 < uVar1) &&
             ((this->Ru).
              super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
              .super_ChConstraint.b_i = pdVar2[uVar4], uVar5 < uVar1)) {
            (this->Rv).
            super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
            .super_ChConstraint.b_i = pdVar2[uVar5];
            return;
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

virtual void ContIntToDescriptor(const unsigned int off_L,
                                     const ChVectorDynamic<>& L,
                                     const ChVectorDynamic<>& Qc) override {
        // base behaviour too
        ChContactNSC<Ta, Tb>::ContIntToDescriptor(off_L, L, Qc);

        Rx.Set_l_i(L(off_L + 3));
        Ru.Set_l_i(L(off_L + 4));
        Rv.Set_l_i(L(off_L + 5));

        Rx.Set_b_i(Qc(off_L + 3));
        Ru.Set_b_i(Qc(off_L + 4));
        Rv.Set_b_i(Qc(off_L + 5));
    }